

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O0

void build_quest_stairs(player *p,loc grid)

{
  _Bool _Var1;
  byte local_21;
  loc local_20;
  loc new_grid;
  player *p_local;
  loc grid_local;
  
  local_20 = p->grid;
  new_grid = (loc)p;
  p_local = (player *)grid;
  while( true ) {
    _Var1 = square_changeable((chunk *)cave,(loc_conflict)p_local);
    local_21 = 0;
    if (!_Var1) {
      _Var1 = square_ispassable((chunk *)cave,(loc_conflict)p_local);
      local_21 = 0;
      if (_Var1) {
        _Var1 = square_isdoor((chunk *)cave,(loc_conflict)p_local);
        local_21 = _Var1 ^ 0xff;
      }
    }
    if ((local_21 & 1) == 0) break;
    scatter(cave,&local_20,(loc)p_local,L'\x01',false);
    p_local = (player *)local_20;
  }
  push_object((loc_conflict)p_local);
  msg("A magical staircase appears...");
  square_set_feat((chunk *)cave,(loc_conflict)p_local,L'\x06');
  *(uint *)(*(long *)((long)new_grid + 0x470) + 0x34) =
       *(uint *)(*(long *)((long)new_grid + 0x470) + 0x34) | 0x60;
  return;
}

Assistant:

static void build_quest_stairs(struct player *p, struct loc grid)
{
	struct loc new_grid = p->grid;

	/* Stagger around */
	while (!square_changeable(cave, grid) &&
		   square_ispassable(cave, grid) &&
		   !square_isdoor(cave, grid)) {
		/* Pick a location */
		scatter(cave, &new_grid, grid, 1, false);

		/* Stagger */
		grid = new_grid;
	}

	/* Push any objects */
	push_object(grid);

	/* Explain the staircase */
	msg("A magical staircase appears...");

	/* Create stairs down */
	square_set_feat(cave, grid, FEAT_MORE);

	/* Update the visuals */
	p->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
}